

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::~LogMessage(LogMessage *this)

{
  LogMessageData *pLVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  Flush(this);
  pLVar1 = this->data_;
  lVar2 = *in_FS_OFFSET;
  if (pLVar1 == (LogMessageData *)(lVar2 + -0x7728)) {
    (pLVar1->stream_).super_ostream._vptr_basic_ostream = (_func_int **)&PTR__LogStream_001426c8;
    *(undefined ***)&(pLVar1->stream_).super_ostream.field_0x58 = &PTR__LogStream_001426f0;
    *(code **)&(pLVar1->stream_).super_ostream.field_0x8 = __assert_fail;
    std::locale::~locale((locale *)&(pLVar1->stream_).super_ostream.field_0x40);
    std::ios_base::~ios_base((ios_base *)&(pLVar1->stream_).super_ostream.field_0x58);
    *(undefined1 *)(lVar2 + -0x7730) = 1;
  }
  else {
    pLVar1 = this->allocated_;
    if (pLVar1 != (LogMessageData *)0x0) {
      (pLVar1->stream_).super_ostream._vptr_basic_ostream = (_func_int **)&PTR__LogStream_001426c8;
      *(undefined ***)&(pLVar1->stream_).super_ostream.field_0x58 = &PTR__LogStream_001426f0;
      *(code **)&(pLVar1->stream_).super_ostream.field_0x8 = __assert_fail;
      std::locale::~locale((locale *)&(pLVar1->stream_).super_ostream.field_0x40);
      std::ios_base::~ios_base((ios_base *)&(pLVar1->stream_).super_ostream.field_0x58);
      operator_delete(pLVar1,0x7728);
      return;
    }
  }
  return;
}

Assistant:

LogMessage::~LogMessage() {
  Flush();
#ifdef GLOG_THREAD_LOCAL_STORAGE
  if (data_ == static_cast<void*>(&thread_msg_data)) {
    data_->~LogMessageData();
    thread_data_available = true;
  }
  else {
    delete allocated_;
  }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
  delete allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
}